

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_nmake.cpp
# Opt level: O1

ProStringList * __thiscall
NmakeMakefileGenerator::extraSubTargetDependencies
          (ProStringList *__return_storage_ptr__,NmakeMakefileGenerator *this)

{
  long in_FS_OFFSET;
  ProString local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  ProString::ProString(&local_48,"$(MAKEFILE)");
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)__return_storage_ptr__,0,&local_48);
  QList<ProString>::end(&__return_storage_ptr__->super_QList<ProString>);
  if (&(local_48.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_48.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_48.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList NmakeMakefileGenerator::extraSubTargetDependencies()
{
    return { "$(MAKEFILE)" };
}